

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O3

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersGL<Diligent::ComputePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,ComputePipelineStateCreateInfo *CreateInfo)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  undefined4 extraout_var;
  char (*in_RCX) [60];
  char (*Args_1) [86];
  long lVar6;
  IShader *pIVar7;
  long *plVar8;
  bool bVar9;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> pShaderImpl;
  string msg;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> local_f8;
  SerializedPipelineStateImpl *local_f0;
  void *local_e8;
  void *pvStack_e0;
  long local_d8;
  long local_d0;
  undefined1 local_c8 [32];
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 local_a8;
  char *local_a0;
  ShaderMacro *local_98;
  Uint32 local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined4 local_74;
  SHADER_SOURCE_LANGUAGE local_70;
  SHADER_COMPILER local_6c;
  ShaderVersion local_68;
  ShaderVersion SStack_60;
  ShaderVersion local_58;
  ShaderVersion SStack_50;
  undefined8 local_48;
  char *pcStack_40;
  char *local_38;
  
  local_e8 = (void *)0x0;
  pvStack_e0 = (void *)0x0;
  local_d8 = 0;
  local_f0 = this;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[39]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsComputePipeline()",(char (*) [39])in_RCX);
    in_RCX = (char (*) [60])0x101;
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x101);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    pvStack_e0 = (void *)0x0;
    if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
      FormatString<char[26],char[57]>
                ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE",
                 (char (*) [57])in_RCX);
      in_RCX = (char (*) [60])0x105;
      DebugAssertionFailed
                ((Char *)local_c8._0_8_,"ExtractShaders",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x105);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
    }
  }
  pIVar7 = CreateInfo->pCS;
  if (pIVar7 == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS != nullptr",(char (*) [26])in_RCX);
    in_RCX = (char (*) [60])0x106;
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x106);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    pIVar7 = CreateInfo->pCS;
  }
  iVar5 = (*(pIVar7->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar5) + 8) != 0x20) {
    FormatString<char[26],char[60]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE",in_RCX);
    in_RCX = (char (*) [60])0x107;
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x107);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  pIVar7 = CreateInfo->pCS;
  local_f8.m_pObject = (SerializedShaderImpl *)0x0;
  if (pIVar7 != (IShader *)0x0) {
    (**(pIVar7->super_IDeviceObject).super_IObject._vptr_IObject)
              (pIVar7,SerializedShaderImpl::IID_InternalImpl,&local_f8);
    if (local_f8.m_pObject != (SerializedShaderImpl *)0x0) goto LAB_001e37e4;
  }
  FormatString<char[40]>
            ((string *)local_c8,(char (*) [40])"Unexpected shader object implementation");
  in_RCX = (char (*) [60])0x10a;
  DebugAssertionFailed
            ((Char *)local_c8._0_8_,"ExtractShaders",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
             ,0x10a);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
LAB_001e37e4:
  PipelineStateUtils::WaitUntilShaderReadyIfRequested<Diligent::SerializedShaderImpl>
            (&local_f8,true);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>>
  ::emplace_back<Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>&>
            ((vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>>
              *)&local_e8,&local_f8);
  pvVar4 = pvStack_e0;
  pvVar3 = local_e8;
  if (local_e8 == pvStack_e0) {
    FormatString<char[26],char[22]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])in_RCX);
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10f);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  RefCntAutoPtr<Diligent::SerializedShaderImpl>::Release(&local_f8);
  if ((local_f0->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_f0->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[64]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty()",
               (char (*) [64])local_f0);
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x222);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  local_d0 = (long)pvVar4 - (long)pvVar3 >> 4;
  if (pvVar4 != pvVar3) {
    lVar6 = local_d0 + (ulong)(local_d0 == 0);
    plVar8 = (long *)((long)pvVar3 + 8);
    do {
      lVar1 = *plVar8;
      lVar2 = *(long *)(lVar1 + 200);
      local_c8._8_8_ = *(size_type *)(lVar1 + 0x20);
      bVar9 = *(char *)(lVar2 + 0x118) != '\0';
      local_c8._16_8_ = *(size_type *)(lVar2 + 0xf0);
      local_70 = *(SHADER_SOURCE_LANGUAGE *)(lVar1 + 0x70);
      if (bVar9) {
        local_70 = SHADER_SOURCE_LANGUAGE_GLSL;
      }
      local_a8 = *(anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 *)(lVar2 + 0xf8);
      local_a0 = *(char **)(lVar1 + 0x40);
      if (bVar9) {
        local_a0 = "main";
      }
      local_c8._0_8_ = (Char *)0x0;
      local_c8._24_8_ = 0;
      local_98 = (ShaderMacro *)0x0;
      local_90 = 0;
      local_8c = *(undefined8 *)(lVar1 + 0x54);
      uStack_84 = *(undefined8 *)(lVar1 + 0x5c);
      local_7c = *(undefined8 *)(lVar1 + 100);
      local_74 = *(undefined4 *)(lVar1 + 0x6c);
      local_6c = SHADER_COMPILER_DEFAULT;
      local_68 = *(ShaderVersion *)(lVar1 + 0x78);
      SStack_60 = *(ShaderVersion *)(lVar1 + 0x80);
      local_58 = *(ShaderVersion *)(lVar1 + 0x88);
      SStack_50 = *(ShaderVersion *)(lVar1 + 0x90);
      local_48 = *(undefined8 *)(lVar1 + 0x98);
      pcStack_40 = *(char **)(lVar1 + 0xa0);
      local_38 = *(char **)(lVar1 + 0xa8);
      SerializeShaderCreateInfo(local_f0,OpenGL,(ShaderCreateInfo *)local_c8);
      plVar8 = plVar8 + 2;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  Args_1 = (char (*) [86])
           (((long)(local_f0->m_Data).Shaders._M_elems[0].
                   super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_f0->m_Data).Shaders._M_elems[0].
                   super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  if ((long)Args_1 - local_d0 != 0) {
    FormatString<char[26],char[86]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size()"
               ,Args_1);
    DebugAssertionFailed
              ((Char *)local_c8._0_8_,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x22c);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_d8 - (long)pvVar3);
  }
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersGL(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoGL> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty());
    for (size_t i = 0; i < ShaderStages.size(); ++i)
    {
        const auto& Stage             = ShaderStages[i];
        const auto& CI                = Stage.pShader->GetCreateInfo();
        const auto* pCompiledShaderGL = Stage.pShader->GetShader<CompiledShaderGL>(DeviceObjectArchive::DeviceType::OpenGL);
        const auto  SerCI             = pCompiledShaderGL->GetSerializationCI(CI);

        SerializeShaderCreateInfo(DeviceType::OpenGL, SerCI);
    }
    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size());
}